

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::alignSequences(Graph *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  ostream *poVar9;
  reference pvVar10;
  reference pvVar11;
  int local_3d8;
  int local_3d4;
  int j_3;
  int i_3;
  undefined1 local_3b0 [40];
  Vertex *v_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Vertex,_std::allocator<Vertex>_> *__range1_2;
  fstream file;
  ostream local_360 [512];
  undefined1 local_160 [32];
  undefined1 local_140 [40];
  Vertex *v;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Vertex,_std::allocator<Vertex>_> *__range1_1;
  int j_2;
  int i_2;
  vector<Vertex,_std::allocator<Vertex>_> best_clique;
  vector<Vertex,_std::allocator<Vertex>_> current_clique;
  int count;
  int index;
  int local_a0;
  int local_9c;
  int j_1;
  int i_1;
  int local_74;
  int local_70;
  int j;
  int i;
  vector<int,_std::allocator<int>_> *line;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range1;
  allocator<std::vector<int,_std::allocator<int>_>_> local_31;
  undefined1 local_30 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  matrix;
  int size;
  Graph *this_local;
  
  sVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::size(&this->vertices);
  matrix.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar4;
  sVar4 = (size_type)
          matrix.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_31);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_30,sVar4,&local_31);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_31);
  __end1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)local_30);
  line = (vector<int,_std::allocator<int>_> *)
         std::
         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                     *)&line), bVar1) {
    _i = __gnu_cxx::
         __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
         ::operator*(&__end1);
    j = 0;
    std::vector<int,_std::allocator<int>_>::resize
              (_i,(long)matrix.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,&j);
    __gnu_cxx::
    __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator++(&__end1);
  }
  for (local_70 = 0;
      local_70 <
      matrix.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_70 = local_70 + 1) {
    for (local_74 = 0;
        local_74 <
        matrix.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_74 = local_74 + 1) {
      if (local_70 != local_74) {
        pvVar5 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                           (&this->vertices,(long)local_70);
        std::vector<Vertex,_std::allocator<Vertex>_>::operator[](&this->vertices,(long)local_74);
        Vertex::getSequence_abi_cxx11_((Vertex *)&j_1);
        bVar1 = Vertex::doesMatch(pvVar5,(string *)&j_1);
        std::__cxx11::string::~string((string *)&j_1);
        if (bVar1) {
          pvVar6 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)local_30,(long)local_70);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_74);
          *pvVar7 = 1;
        }
      }
    }
  }
  for (local_9c = 0;
      local_9c <
      matrix.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_9c = local_9c + 1) {
    for (local_a0 = 0;
        local_a0 <
        matrix.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_a0 = local_a0 + 1) {
      if (local_9c != local_a0) {
        pvVar5 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                           (&this->vertices,(long)local_9c);
        std::vector<Vertex,_std::allocator<Vertex>_>::operator[](&this->vertices,(long)local_a0);
        Vertex::getDelSequence_abi_cxx11_((Vertex *)&count);
        bVar1 = Vertex::doesMatchWithErrors(pvVar5,(string *)&count);
        std::__cxx11::string::~string((string *)&count);
        if (bVar1) {
          pvVar6 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)local_30,(long)local_9c);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_a0);
          *pvVar7 = 1;
          pvVar5 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                             (&this->vertices,(long)local_a0);
          Vertex::setComparsion(pvVar5,true);
        }
      }
    }
  }
  current_clique.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._0_4_ = 1;
  std::vector<Vertex,_std::allocator<Vertex>_>::vector
            ((vector<Vertex,_std::allocator<Vertex>_> *)
             &best_clique.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Vertex,_std::allocator<Vertex>_>::vector
            ((vector<Vertex,_std::allocator<Vertex>_> *)&j_2);
  for (__range1_1._4_4_ = 0;
      __range1_1._4_4_ <
      matrix.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      __range1_1._4_4_ = __range1_1._4_4_ + 1) {
    std::vector<Vertex,_std::allocator<Vertex>_>::clear
              ((vector<Vertex,_std::allocator<Vertex>_> *)
               &best_clique.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    current_clique.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    for (__range1_1._0_4_ = 0;
        (int)__range1_1 <
        matrix.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        __range1_1._0_4_ = (int)__range1_1 + 1) {
      if (__range1_1._4_4_ != (int)__range1_1) {
        pvVar6 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,(long)__range1_1._4_4_);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)(int)__range1_1);
        if (*pvVar7 == 1) {
          pvVar5 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                             (&this->vertices,
                              (long)current_clique.
                                    super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_);
          iVar2 = Vertex::getSeqNumber(pvVar5);
          pvVar5 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                             (&this->vertices,(long)(int)__range1_1);
          iVar3 = Vertex::getSeqNumber(pvVar5);
          if (iVar2 != iVar3) {
            current_clique.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = (int)__range1_1;
            if ((int)current_clique.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage == 1) {
              pvVar5 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                                 (&this->vertices,(long)__range1_1._4_4_);
              std::vector<Vertex,_std::allocator<Vertex>_>::push_back
                        ((vector<Vertex,_std::allocator<Vertex>_> *)
                         &best_clique.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,pvVar5);
              current_clique.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
            }
            pvVar5 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                               (&this->vertices,(long)(int)__range1_1);
            std::vector<Vertex,_std::allocator<Vertex>_>::push_back
                      ((vector<Vertex,_std::allocator<Vertex>_> *)
                       &best_clique.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,pvVar5);
            pvVar6 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_30,(long)__range1_1._4_4_);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar6,(long)(int)__range1_1);
            *pvVar7 = 0;
          }
        }
        sVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::size
                          ((vector<Vertex,_std::allocator<Vertex>_> *)
                           &best_clique.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        sVar8 = std::vector<Vertex,_std::allocator<Vertex>_>::size
                          ((vector<Vertex,_std::allocator<Vertex>_> *)&j_2);
        if (sVar8 < sVar4) {
          std::vector<Vertex,_std::allocator<Vertex>_>::operator=
                    ((vector<Vertex,_std::allocator<Vertex>_> *)&j_2,
                     (vector<Vertex,_std::allocator<Vertex>_> *)
                     &best_clique.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
      }
    }
  }
  poVar9 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<(poVar9,"CLIQUE: ");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  __end1_1 = std::vector<Vertex,_std::allocator<Vertex>_>::begin
                       ((vector<Vertex,_std::allocator<Vertex>_> *)&j_2);
  v = (Vertex *)
      std::vector<Vertex,_std::allocator<Vertex>_>::end
                ((vector<Vertex,_std::allocator<Vertex>_> *)&j_2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>
                             *)&v), bVar1) {
    local_140._32_8_ =
         __gnu_cxx::__normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>::
         operator*(&__end1_1);
    bVar1 = Vertex::getComparsionStatus((Vertex *)local_140._32_8_);
    if (bVar1) {
      Vertex::getDelSequence_abi_cxx11_((Vertex *)local_140);
      std::operator<<((ostream *)&std::cout,(string *)local_140);
      std::__cxx11::string::~string((string *)local_140);
    }
    else {
      Vertex::getSequence_abi_cxx11_((Vertex *)local_160);
      std::operator<<((ostream *)&std::cout,(string *)local_160);
      std::__cxx11::string::~string((string *)local_160);
    }
    poVar9 = std::operator<<((ostream *)&std::cout," seq no.: ");
    iVar2 = Vertex::getSeqNumber((Vertex *)local_140._32_8_);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar2);
    poVar9 = std::operator<<(poVar9," pos: ");
    iVar2 = Vertex::getPosition((Vertex *)local_140._32_8_);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar2);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>::
    operator++(&__end1_1);
  }
  std::fstream::fstream(&__range1_2,"output.txt",_S_out);
  __end1_2 = std::vector<Vertex,_std::allocator<Vertex>_>::begin
                       ((vector<Vertex,_std::allocator<Vertex>_> *)&j_2);
  v_1 = (Vertex *)
        std::vector<Vertex,_std::allocator<Vertex>_>::end
                  ((vector<Vertex,_std::allocator<Vertex>_> *)&j_2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>
                             *)&v_1), bVar1) {
    local_3b0._32_8_ =
         __gnu_cxx::__normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>::
         operator*(&__end1_2);
    bVar1 = Vertex::getComparsionStatus((Vertex *)local_3b0._32_8_);
    if (bVar1) {
      Vertex::getDelSequence_abi_cxx11_((Vertex *)local_3b0);
      std::operator<<(local_360,(string *)local_3b0);
      std::__cxx11::string::~string((string *)local_3b0);
    }
    else {
      Vertex::getSequence_abi_cxx11_((Vertex *)&j_3);
      std::operator<<(local_360,(string *)&j_3);
      std::__cxx11::string::~string((string *)&j_3);
    }
    poVar9 = std::operator<<(local_360," seq no.: ");
    iVar2 = Vertex::getSeqNumber((Vertex *)local_3b0._32_8_);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar2);
    poVar9 = std::operator<<(poVar9," pos: ");
    iVar2 = Vertex::getPosition((Vertex *)local_3b0._32_8_);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar2);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>::
    operator++(&__end1_2);
  }
  std::ostream::operator<<(local_360,std::endl<char,std::char_traits<char>>);
  for (local_3d4 = 0;
      sVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::size
                        ((vector<Vertex,_std::allocator<Vertex>_> *)&j_2), local_3d4 < (int)sVar4;
      local_3d4 = local_3d4 + 1) {
    poVar9 = std::operator<<(local_360,">seq no. ");
    pvVar5 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                       ((vector<Vertex,_std::allocator<Vertex>_> *)&j_2,(long)local_3d4);
    iVar2 = Vertex::getSeqNumber(pvVar5);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar2);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    local_3d8 = 0;
    while( true ) {
      pvVar10 = std::
                vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                ::operator[](&this->sequences,(long)local_3d4);
      sVar4 = std::vector<char,_std::allocator<char>_>::size(pvVar10);
      if ((int)sVar4 <= local_3d8) break;
      pvVar5 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                         ((vector<Vertex,_std::allocator<Vertex>_> *)&j_2,(long)local_3d4);
      iVar2 = Vertex::getPosition(pvVar5);
      if (local_3d8 == iVar2 + -1) {
        std::operator<<(local_360,"___");
      }
      pvVar5 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                         ((vector<Vertex,_std::allocator<Vertex>_> *)&j_2,(long)local_3d4);
      iVar2 = Vertex::getPosition(pvVar5);
      if (local_3d8 == iVar2 + -1 + this->treshhold) {
        std::operator<<(local_360,"___");
      }
      pvVar10 = std::
                vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                ::operator[](&this->sequences,(long)local_3d4);
      pvVar11 = std::vector<char,_std::allocator<char>_>::operator[](pvVar10,(long)local_3d8);
      std::operator<<(local_360,*pvVar11);
      local_3d8 = local_3d8 + 1;
    }
    std::ostream::operator<<(local_360,std::endl<char,std::char_traits<char>>);
  }
  std::fstream::~fstream(&__range1_2);
  std::vector<Vertex,_std::allocator<Vertex>_>::~vector
            ((vector<Vertex,_std::allocator<Vertex>_> *)&j_2);
  std::vector<Vertex,_std::allocator<Vertex>_>::~vector
            ((vector<Vertex,_std::allocator<Vertex>_> *)
             &best_clique.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_30);
  return;
}

Assistant:

void Graph::alignSequences(){
    int size = this->vertices.size();
    vector<vector<int> > matrix(size);
    for(auto &line : matrix){
        line.resize(size, 0);
    }
    for(int i = 0; i < size; i++){
        for(int j = 0; j < size; j++){
            if(i == j)
                continue;
            if(this->vertices[i].doesMatch(vertices[j].getSequence())){
                matrix[i][j] = 1;
            }
        }
    }
    for(int i = 0; i < size; ++i){
        for(int j = 0; j < size; ++j){
            if(i == j)
                continue;
            if(this->vertices[i].doesMatchWithErrors(this->vertices[j].getDelSequence())){
                matrix[i][j] = 1;
                this->vertices[j].setComparsion(true);
            }
        }
    }
    int index = 0, count = 1;
    vector<Vertex> current_clique, best_clique;

    for(int i = 0; i < size; i++){
        current_clique.clear();
        index = 0;
        for(int j = 0; j < size; j++){
            if(i == j)
                continue;
            if(matrix[i][j] == 1){
                if(this->vertices[index].getSeqNumber() != this->vertices[j].getSeqNumber()){
                    index = j;
                    if(count == 1){
                        current_clique.push_back(this->vertices[i]);
                        count++;
                    }
                    current_clique.push_back(this->vertices[j]);
                    matrix[i][j] = 0;

                }
            }
            if(current_clique.size() > best_clique.size()){
                best_clique = current_clique;
            }
        }
    }


    cout << endl << "CLIQUE: " << endl;
    for(auto &v : best_clique){
        if(v.getComparsionStatus()){
            cout << v.getDelSequence();
        }else{
            cout << v.getSequence();
        }
        cout << " seq no.: " << v.getSeqNumber()
             << " pos: " << v.getPosition() << endl;
    }

    fstream file("output.txt", ios::out);
    for(auto &v : best_clique){
        if(v.getComparsionStatus()){
            file << v.getDelSequence();
        }else{
            file << v.getSequence();
        }
        file << " seq no.: " << v.getSeqNumber()
             << " pos: " << v.getPosition() << endl;
    }
    file << endl;
    for(int i = 0; i < (int)best_clique.size(); i++){
        file << ">seq no. " << best_clique[i].getSeqNumber() << endl;
        for(int j = 0; j < (int)this->sequences[i].size(); j++){
            if(j == best_clique[i].getPosition() - 1){
                file << "___";
            }
            if(j == best_clique[i].getPosition() - 1 + this->treshhold){
                file << "___";
            }
            file << this->sequences[i][j];
        }
        file << endl;
    }
}